

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_create_resolving_functions(JSContext *ctx,JSValue *resolving_funcs,JSValue promise)

{
  JSValue v;
  JSValue v_00;
  JSValue obj_00;
  JSValue func_obj;
  JSValue v_01;
  int iVar1;
  int *piVar2;
  JSValueUnion *pJVar3;
  JSValueUnion *pJVar4;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  long in_RSI;
  JSContext *in_RDI;
  JSValue JVar5;
  int ret;
  int i;
  JSPromiseFunctionDataResolved *sr;
  JSPromiseFunctionData *s;
  JSValue obj;
  JSValueUnion *in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  JSClassID in_stack_ffffffffffffff9c;
  JSValueUnion in_stack_ffffffffffffffa0;
  JSContext *in_stack_ffffffffffffffa8;
  int iVar6;
  JSValueUnion JVar7;
  JSContext *pJVar8;
  int local_4;
  
  piVar2 = (int *)js_malloc(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (piVar2 == (int *)0x0) {
    local_4 = -1;
  }
  else {
    *piVar2 = 1;
    piVar2[1] = 0;
    local_4 = 0;
    for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
      JVar5.tag._0_4_ = local_4;
      JVar5.u.ptr = in_stack_ffffffffffffffa8;
      JVar5.tag._4_4_ = iVar6;
      JVar5 = JS_NewObjectProtoClass
                        ((JSContext *)in_stack_ffffffffffffffa0.ptr,JVar5,in_stack_ffffffffffffff9c)
      ;
      in_stack_ffffffffffffffa0 = JVar5.u;
      in_stack_ffffffffffffffa8 = (JSContext *)JVar5.tag;
      JVar7 = in_stack_ffffffffffffffa0;
      pJVar8 = in_stack_ffffffffffffffa8;
      iVar1 = JS_IsException(JVar5);
      if (iVar1 != 0) {
LAB_00180815:
        if (iVar6 != 0) {
          v_00.u._4_4_ = in_stack_ffffffffffffff9c;
          v_00.u.int32 = in_stack_ffffffffffffff98;
          v_00.tag = (int64_t)in_stack_ffffffffffffffa0.ptr;
          JS_FreeValue((JSContext *)in_stack_ffffffffffffff90.ptr,v_00);
        }
        local_4 = -1;
        break;
      }
      pJVar3 = (JSValueUnion *)
               js_malloc(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
      if (pJVar3 == (JSValueUnion *)0x0) {
        v.u._4_4_ = in_stack_ffffffffffffff9c;
        v.u.int32 = in_stack_ffffffffffffff98;
        v.tag = (int64_t)in_stack_ffffffffffffffa0.ptr;
        JS_FreeValue((JSContext *)in_stack_ffffffffffffff90.ptr,v);
        goto LAB_00180815;
      }
      *piVar2 = *piVar2 + 1;
      pJVar3[2].ptr = piVar2;
      v_01.tag = in_RCX;
      v_01.u.float64 = in_RDX.float64;
      pJVar4 = pJVar3;
      JVar5 = JS_DupValue(in_RDI,v_01);
      in_stack_ffffffffffffff90 = JVar5.u;
      in_stack_ffffffffffffff98 = (undefined4)JVar5.tag;
      in_stack_ffffffffffffff9c = JVar5.tag._4_4_;
      pJVar3->ptr = (void *)in_stack_ffffffffffffff90;
      pJVar3[1] = (JSValueUnion)JVar5.tag;
      obj_00.tag = (int64_t)pJVar8;
      obj_00.u.ptr = JVar7.ptr;
      JS_SetOpaque(obj_00,pJVar4);
      func_obj.tag = (int64_t)pJVar8;
      func_obj.u.ptr = JVar7.ptr;
      js_function_set_properties
                ((JSContext *)pJVar4,func_obj,(JSAtom)((ulong)piVar2 >> 0x20),(int)piVar2);
      pJVar4 = (JSValueUnion *)(in_RSI + (long)iVar6 * 0x10);
      pJVar4->ptr = (void *)JVar7;
      pJVar4[1].ptr = pJVar8;
      in_stack_ffffffffffffff88 = pJVar3;
    }
    js_promise_resolve_function_free_resolved
              ((JSRuntime *)in_stack_ffffffffffffff90.ptr,
               (JSPromiseFunctionDataResolved *)in_stack_ffffffffffffff88);
  }
  return local_4;
}

Assistant:

static int js_create_resolving_functions(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst promise)

{
    JSValue obj;
    JSPromiseFunctionData *s;
    JSPromiseFunctionDataResolved *sr;
    int i, ret;

    sr = js_malloc(ctx, sizeof(*sr));
    if (!sr)
        return -1;
    sr->ref_count = 1;
    sr->already_resolved = FALSE; /* must be shared between the two functions */
    ret = 0;
    for(i = 0; i < 2; i++) {
        obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                     JS_CLASS_PROMISE_RESOLVE_FUNCTION + i);
        if (JS_IsException(obj))
            goto fail;
        s = js_malloc(ctx, sizeof(*s));
        if (!s) {
            JS_FreeValue(ctx, obj);
        fail:

            if (i != 0)
                JS_FreeValue(ctx, resolving_funcs[0]);
            ret = -1;
            break;
        }
        sr->ref_count++;
        s->presolved = sr;
        s->promise = JS_DupValue(ctx, promise);
        JS_SetOpaque(obj, s);
        js_function_set_properties(ctx, obj, JS_ATOM_empty_string, 1);
        resolving_funcs[i] = obj;
    }
    js_promise_resolve_function_free_resolved(ctx->rt, sr);
    return ret;
}